

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

packed_view_t *
bwtil::load_packed_view_from_file
          (packed_view_t *__return_storage_ptr__,size_t width,size_t size,FILE *fp)

{
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> _Stack_38;
  
  bv::internal::packed_view<std::vector>::packed_view(__return_storage_ptr__,width,size);
  load_bitview_from_file((bitview_t *)&_Stack_38,&__return_storage_ptr__->_bits,size * width,fp);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&_Stack_38);
  return __return_storage_ptr__;
}

Assistant:

inline packed_view_t load_packed_view_from_file(size_t width, size_t size, FILE * fp){

	 packed_view_t pv = packed_view_t(width,size);
	 load_bitview_from_file(pv.bits(),size*width ,fp);

	 return pv;

	/*if(width<=8)
		return load_packed_view_from_file_T<uint8_t>(width, size, fp);
	if(width<=16)
		return load_packed_view_from_file_T<uint16_t>(width, size, fp);
	if(width<=32)
		return load_packed_view_from_file_T<uint32_t>(width, size, fp);

	return load_packed_view_from_file_T<uint64_t>(width, size, fp);*/

}